

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<float,double>(uint length,float value)

{
  _func_int ***ppp_Var1;
  uint uVar2;
  float *pfVar3;
  double *__p;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  float *local_38;
  shared_ptr<float> pt;
  shared_ptr<double> pu;
  
  pfVar3 = nosimd::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)&local_38,pfVar3,
             nosimd::common::free<float>);
  __p = nosimd::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<double>);
  pfVar3 = local_38;
  for (uVar2 = length; 0xf < (int)uVar2; uVar2 = uVar2 - 0x10) {
    *pfVar3 = value;
    pfVar3[1] = value;
    pfVar3[2] = value;
    pfVar3[3] = value;
    pfVar3[4] = value;
    pfVar3[5] = value;
    pfVar3[6] = value;
    pfVar3[7] = value;
    pfVar3[8] = value;
    pfVar3[9] = value;
    pfVar3[10] = value;
    pfVar3[0xb] = value;
    pfVar3[0xc] = value;
    pfVar3[0xd] = value;
    pfVar3[0xe] = value;
    pfVar3[0xf] = value;
    pfVar3 = pfVar3 + 0x10;
  }
  if (7 < (int)uVar2) {
    *pfVar3 = value;
    pfVar3[1] = value;
    pfVar3[2] = value;
    pfVar3[3] = value;
    pfVar3[4] = value;
    pfVar3[5] = value;
    pfVar3[6] = value;
    pfVar3[7] = value;
    uVar2 = uVar2 - 8;
    pfVar3 = pfVar3 + 8;
  }
  if (3 < (int)uVar2) {
    *pfVar3 = value;
    pfVar3[1] = value;
    pfVar3[2] = value;
    pfVar3[3] = value;
    uVar2 = uVar2 - 4;
    pfVar3 = pfVar3 + 4;
  }
  for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    *pfVar3 = value;
    pfVar3 = pfVar3 + 1;
  }
  nosimd::common::convert<float,double>
            (local_38,(double *)
                      pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar5 = 0;
  do {
    if (length == uVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    ppp_Var1 = &(pt.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar5;
    dVar7 = (double)*ppp_Var1 - (double)value;
    uVar6 = -(ulong)(dVar7 < 0.0);
    uVar5 = uVar5 + 1;
  } while ((double)(~uVar6 & (ulong)dVar7 | (ulong)((double)value - (double)*ppp_Var1) & uVar6) <
           2.220446049250313e-16);
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar4 = "void test_convert(unsigned int, _T) [_T = float, _U = double]";
  *(undefined4 *)(puVar4 + 1) = 0x17;
  *(uint *)((long)puVar4 + 0xc) = length;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}